

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char * columnTypeImpl(NameContext *pNC,Expr *pExpr,char **pzOrigDb,char **pzOrigTab,char **pzOrigCol
                     ,u8 *pEstWidth)

{
  u8 uVar1;
  short sVar2;
  SrcList *pSVar3;
  sqlite3 *psVar4;
  uint uVar5;
  size_t sVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  Expr *pExpr_00;
  ulong uVar9;
  Schema **ppSVar10;
  long lVar11;
  u8 estWidth;
  char *zOrigCol;
  char *zOrigTab;
  char *zOrigDb;
  NameContext sNC;
  u8 local_a1;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  long local_80;
  long local_78;
  Schema *local_70;
  NameContext local_68;
  
  local_a1 = '\x01';
  local_88 = (char *)0x0;
  local_90 = (char *)0x0;
  local_98 = (char *)0x0;
  local_a0 = (char *)0x0;
  uVar1 = pExpr->op;
  if (uVar1 == 'w') {
    local_68.pSrcList = ((pExpr->x).pSelect)->pSrc;
    pExpr_00 = ((pExpr->x).pSelect)->pEList->a[0].pExpr;
LAB_00164380:
    local_68.pParse = pNC->pParse;
    local_68.pNext = pNC;
    local_88 = columnTypeImpl(&local_68,pExpr_00,&local_90,&local_98,&local_a0,&local_a1);
  }
  else {
    if ((uVar1 != 0x9a) && (uVar1 != 0x98)) goto LAB_001643e8;
    if (pNC != (NameContext *)0x0) {
      sVar2 = pExpr->iColumn;
      uVar5 = (uint)sVar2;
      puVar7 = (undefined8 *)0x0;
      do {
        pSVar3 = pNC->pSrcList;
        if (0 < (long)pSVar3->nSrc) {
          lVar11 = 0;
          do {
            if (*(int *)((long)&pSVar3->a[0].iCursor + lVar11) == pExpr->iTable) {
              puVar8 = *(undefined8 **)((long)&pSVar3->a[0].pTab + lVar11);
              puVar7 = *(undefined8 **)((long)&pSVar3->a[0].pSelect + lVar11);
              goto LAB_00164334;
            }
            lVar11 = lVar11 + 0x70;
          } while ((long)pSVar3->nSrc * 0x70 - lVar11 != 0);
        }
        pNC = pNC->pNext;
        puVar8 = (undefined8 *)0x0;
LAB_00164334:
      } while ((pNC != (NameContext *)0x0) && (puVar8 == (undefined8 *)0x0));
      if (puVar8 != (undefined8 *)0x0) {
        if (puVar7 == (undefined8 *)0x0) {
          local_70 = (Schema *)puVar8[0xe];
          if (local_70 != (Schema *)0x0) {
            if (sVar2 < 0) {
              uVar5 = (uint)*(short *)((long)puVar8 + 0x44);
            }
            if ((int)uVar5 < 0) {
              local_a0 = "rowid";
              local_88 = "INTEGER";
            }
            else {
              local_78 = puVar8[1];
              local_80 = (ulong)uVar5 * 0x20;
              local_a0 = *(char **)(local_78 + local_80);
              if ((*(byte *)(local_78 + 0x1b + local_80) & 4) == 0) {
                local_88 = (char *)0x0;
              }
              else {
                local_88 = local_a0;
                sVar6 = strlen(local_a0);
                local_88 = local_88 + sVar6 + 1;
              }
              local_a1 = *(u8 *)(local_78 + 0x1a + local_80);
            }
            local_98 = (char *)*puVar8;
            if (pNC->pParse != (Parse *)0x0) {
              psVar4 = pNC->pParse->db;
              uVar5 = psVar4->nDb;
              if ((int)uVar5 < 1) {
                uVar9 = 0;
              }
              else {
                ppSVar10 = &psVar4->aDb->pSchema;
                uVar9 = 0;
                do {
                  if (*ppSVar10 == local_70) goto LAB_001644b4;
                  uVar9 = uVar9 + 1;
                  ppSVar10 = ppSVar10 + 4;
                } while (uVar5 != uVar9);
                uVar9 = (ulong)uVar5;
              }
LAB_001644b4:
              local_90 = psVar4->aDb[(int)uVar9].zDbSName;
            }
            goto LAB_001643e8;
          }
        }
        else if ((-1 < sVar2) && ((int)uVar5 < *(int *)*puVar7)) {
          pExpr_00 = *(Expr **)((int *)*puVar7 + (ulong)uVar5 * 8 + 2);
          local_68.pSrcList = (SrcList *)puVar7[4];
          goto LAB_00164380;
        }
      }
    }
    local_88 = (char *)0x0;
  }
LAB_001643e8:
  if (pzOrigDb != (char **)0x0) {
    *pzOrigDb = local_90;
    *pzOrigTab = local_98;
    *pzOrigCol = local_a0;
  }
  if (pEstWidth != (u8 *)0x0) {
    *pEstWidth = local_a1;
  }
  return local_88;
}

Assistant:

static const char *columnTypeImpl(
  NameContext *pNC, 
  Expr *pExpr,
#ifdef SQLITE_ENABLE_COLUMN_METADATA
  const char **pzOrigDb,
  const char **pzOrigTab,
  const char **pzOrigCol,
#endif
  u8 *pEstWidth
){
  char const *zType = 0;
  int j;
  u8 estWidth = 1;
#ifdef SQLITE_ENABLE_COLUMN_METADATA
  char const *zOrigDb = 0;
  char const *zOrigTab = 0;
  char const *zOrigCol = 0;
#endif

  assert( pExpr!=0 );
  assert( pNC->pSrcList!=0 );
  switch( pExpr->op ){
    case TK_AGG_COLUMN:
    case TK_COLUMN: {
      /* The expression is a column. Locate the table the column is being
      ** extracted from in NameContext.pSrcList. This table may be real
      ** database table or a subquery.
      */
      Table *pTab = 0;            /* Table structure column is extracted from */
      Select *pS = 0;             /* Select the column is extracted from */
      int iCol = pExpr->iColumn;  /* Index of column in pTab */
      testcase( pExpr->op==TK_AGG_COLUMN );
      testcase( pExpr->op==TK_COLUMN );
      while( pNC && !pTab ){
        SrcList *pTabList = pNC->pSrcList;
        for(j=0;j<pTabList->nSrc && pTabList->a[j].iCursor!=pExpr->iTable;j++);
        if( j<pTabList->nSrc ){
          pTab = pTabList->a[j].pTab;
          pS = pTabList->a[j].pSelect;
        }else{
          pNC = pNC->pNext;
        }
      }

      if( pTab==0 ){
        /* At one time, code such as "SELECT new.x" within a trigger would
        ** cause this condition to run.  Since then, we have restructured how
        ** trigger code is generated and so this condition is no longer 
        ** possible. However, it can still be true for statements like
        ** the following:
        **
        **   CREATE TABLE t1(col INTEGER);
        **   SELECT (SELECT t1.col) FROM FROM t1;
        **
        ** when columnType() is called on the expression "t1.col" in the 
        ** sub-select. In this case, set the column type to NULL, even
        ** though it should really be "INTEGER".
        **
        ** This is not a problem, as the column type of "t1.col" is never
        ** used. When columnType() is called on the expression 
        ** "(SELECT t1.col)", the correct type is returned (see the TK_SELECT
        ** branch below.  */
        break;
      }

      assert( pTab && pExpr->pTab==pTab );
      if( pS ){
        /* The "table" is actually a sub-select or a view in the FROM clause
        ** of the SELECT statement. Return the declaration type and origin
        ** data for the result-set column of the sub-select.
        */
        if( iCol>=0 && iCol<pS->pEList->nExpr ){
          /* If iCol is less than zero, then the expression requests the
          ** rowid of the sub-select or view. This expression is legal (see 
          ** test case misc2.2.2) - it always evaluates to NULL.
          */
          NameContext sNC;
          Expr *p = pS->pEList->a[iCol].pExpr;
          sNC.pSrcList = pS->pSrc;
          sNC.pNext = pNC;
          sNC.pParse = pNC->pParse;
          zType = columnType(&sNC, p,&zOrigDb,&zOrigTab,&zOrigCol, &estWidth); 
        }
      }else if( pTab->pSchema ){
        /* A real table */
        assert( !pS );
        if( iCol<0 ) iCol = pTab->iPKey;
        assert( iCol==-1 || (iCol>=0 && iCol<pTab->nCol) );
#ifdef SQLITE_ENABLE_COLUMN_METADATA
        if( iCol<0 ){
          zType = "INTEGER";
          zOrigCol = "rowid";
        }else{
          zOrigCol = pTab->aCol[iCol].zName;
          zType = sqlite3ColumnType(&pTab->aCol[iCol],0);
          estWidth = pTab->aCol[iCol].szEst;
        }
        zOrigTab = pTab->zName;
        if( pNC->pParse ){
          int iDb = sqlite3SchemaToIndex(pNC->pParse->db, pTab->pSchema);
          zOrigDb = pNC->pParse->db->aDb[iDb].zDbSName;
        }
#else
        if( iCol<0 ){
          zType = "INTEGER";
        }else{
          zType = sqlite3ColumnType(&pTab->aCol[iCol],0);
          estWidth = pTab->aCol[iCol].szEst;
        }
#endif
      }
      break;
    }
#ifndef SQLITE_OMIT_SUBQUERY
    case TK_SELECT: {
      /* The expression is a sub-select. Return the declaration type and
      ** origin info for the single column in the result set of the SELECT
      ** statement.
      */
      NameContext sNC;
      Select *pS = pExpr->x.pSelect;
      Expr *p = pS->pEList->a[0].pExpr;
      assert( ExprHasProperty(pExpr, EP_xIsSelect) );
      sNC.pSrcList = pS->pSrc;
      sNC.pNext = pNC;
      sNC.pParse = pNC->pParse;
      zType = columnType(&sNC, p, &zOrigDb, &zOrigTab, &zOrigCol, &estWidth); 
      break;
    }
#endif
  }

#ifdef SQLITE_ENABLE_COLUMN_METADATA  
  if( pzOrigDb ){
    assert( pzOrigTab && pzOrigCol );
    *pzOrigDb = zOrigDb;
    *pzOrigTab = zOrigTab;
    *pzOrigCol = zOrigCol;
  }
#endif
  if( pEstWidth ) *pEstWidth = estWidth;
  return zType;
}